

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O2

void bn_sub_modulus(u8 *a,u8 *N,u32 n)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = 0;
  for (uVar3 = n - 1; uVar3 < n; uVar3 = uVar3 - 1) {
    bVar1 = N[uVar3];
    bVar2 = a[uVar3];
    a[uVar3] = bVar2 - (char)(uVar4 + bVar1);
    uVar4 = (uint)((uint)bVar2 < uVar4 + bVar1);
  }
  return;
}

Assistant:

void bn_sub_modulus(u8 *a, u8 *N, u32 n)
{
	u32 i;
	u32 dig;
	u8 c;

	c = 0;
	for (i = n - 1; i < n; i--) {
		dig = N[i] + c;
		c = (a[i] < dig);
		a[i] -= dig;
	}
}